

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>::Data
          (Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
           *this,Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
                 *other)

{
  Entry *pEVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*> *pNVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  R RVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar9 = other->numBuckets;
  sVar10 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar10;
  this->spans = (Span *)0x0;
  RVar11 = allocateSpans(sVar9);
  this->spans = (Span *)RVar11.spans;
  if (RVar11.nSpans != 0) {
    lVar8 = 0;
    sVar9 = 0;
    do {
      pSVar2 = other->spans;
      sVar10 = 0;
      do {
        uVar6 = (ulong)pSVar2->offsets[sVar10 + lVar8];
        if (uVar6 != 0xff) {
          pEVar3 = pSVar2[sVar9].entries;
          pNVar7 = Span<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
                   ::insert(this->spans + sVar9,sVar10);
          pEVar1 = pEVar3 + uVar6;
          uVar4 = *(undefined8 *)(pEVar1->storage).data;
          uVar5 = *(undefined8 *)((pEVar1->storage).data + 8);
          (pNVar7->key).glyph = (int)uVar4;
          (pNVar7->key).subPixelPosition.x = (QFixed)(int)((ulong)uVar4 >> 0x20);
          *(undefined8 *)&(pNVar7->key).subPixelPosition.y = uVar5;
          pNVar7->value = *(Glyph **)(pEVar3[uVar6].storage.data + 0x10);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != 0x80);
      sVar9 = sVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (sVar9 != RVar11.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }